

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O3

Symbol * __thiscall
anon_unknown.dwarf_1efa1d1::InstanceBuilder::createInstance
          (InstanceBuilder *this,HierarchicalInstanceSyntax *syntax,
          HierarchyOverrideNode *overrideNode)

{
  int iVar1;
  InstanceSymbol *args_1;
  undefined4 extraout_var;
  ResolvedConfig *pRVar2;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> local_30;
  
  this->paramBuilder->overrideNode = overrideNode;
  getNameLoc(&local_30,syntax);
  args_1 = slang::BumpAllocator::
           emplace<slang::ast::InstanceSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::DefinitionSymbol_const&,slang::ast::ParameterBuilder&,slang::bitmask<slang::ast::InstanceFlags>&>
                     (&this->comp->super_BumpAllocator,this->comp,&local_30.first,&local_30.second,
                      this->definition,this->paramBuilder,&this->flags);
  iVar1 = slang::SmallVectorBase<unsigned_int>::copy
                    (&(this->path).super_SmallVectorBase<unsigned_int>,(EVP_PKEY_CTX *)this->comp,
                     src);
  (args_1->super_InstanceSymbolBase).arrayPath._M_ptr = (pointer)CONCAT44(extraout_var,iVar1);
  (args_1->super_InstanceSymbolBase).arrayPath._M_extent._M_extent_value = extraout_RDX;
  (args_1->super_InstanceSymbolBase).super_Symbol.originatingSyntax = &syntax->super_SyntaxNode;
  slang::ast::Symbol::setAttributes((Symbol *)args_1,(this->context->scope).ptr,this->attributes);
  pRVar2 = this->resolvedConfig;
  if (pRVar2 != (ResolvedConfig *)0x0) {
    if (this->newConfigRoot != (ConfigBlockSymbol *)0x0) {
      pRVar2 = slang::BumpAllocator::
               emplace<slang::ast::ResolvedConfig,slang::ast::ConfigBlockSymbol_const&,slang::ast::InstanceSymbol&>
                         (&this->comp->super_BumpAllocator,this->newConfigRoot,args_1);
    }
    args_1->resolvedConfig = pRVar2;
  }
  return (Symbol *)args_1;
}

Assistant:

Symbol* createInstance(const HierarchicalInstanceSyntax& syntax,
                           const HierarchyOverrideNode* overrideNode) {
        paramBuilder->setOverrides(overrideNode);
        auto [name, loc] = getNameLoc(syntax);
        auto inst = comp.emplace<InstanceSymbol>(comp, name, loc, *definition, *paramBuilder,
                                                 flags);
        inst->arrayPath = path.copy(comp);
        inst->setSyntax(syntax);
        inst->setAttributes(*context.scope, attributes);

        if (resolvedConfig) {
            if (newConfigRoot)
                inst->resolvedConfig = comp.emplace<ResolvedConfig>(*newConfigRoot, *inst);
            else
                inst->resolvedConfig = resolvedConfig;
        }

        return inst;
    }